

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::emit_dqt(jpeg_encoder *this)

{
  int j;
  long lVar1;
  int32 (*paiVar2) [64];
  int i;
  ulong uVar3;
  
  paiVar2 = this->m_quantization_tables;
  for (uVar3 = 0; uVar3 < (ulong)(this->m_num_components == '\x03') + 1; uVar3 = uVar3 + 1) {
    emit_marker(this,0xdb);
    emit_word(this,0x43);
    emit_byte(this,(uint8)uVar3);
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
      emit_byte(this,(uint8)(*paiVar2)[lVar1]);
    }
    paiVar2 = paiVar2 + 1;
  }
  return;
}

Assistant:

void jpeg_encoder::emit_dqt()
	{
		for (int i = 0; i < ((m_num_components == 3) ? 2 : 1); i++)
		{
			emit_marker(M_DQT);
			emit_word(64 + 1 + 2);
			emit_byte(static_cast<uint8>(i));
			for (int j = 0; j < 64; j++)
				emit_byte(static_cast<uint8>(m_quantization_tables[i][j]));
		}
	}